

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O2

unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true> __thiscall
duckdb::PhysicalOrder::GetLocalSourceState
          (PhysicalOrder *this,ExecutionContext *context,GlobalSourceState *gstate_p)

{
  _func_int **in_RAX;
  PhysicalOrderGlobalSourceState *in_RCX;
  _func_int **local_18;
  
  local_18 = in_RAX;
  make_uniq<duckdb::PhysicalOrderLocalSourceState,duckdb::PhysicalOrderGlobalSourceState&>
            ((duckdb *)&local_18,in_RCX);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = local_18;
  return (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)
         (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)this;
}

Assistant:

unique_ptr<LocalSourceState> PhysicalOrder::GetLocalSourceState(ExecutionContext &context,
                                                                GlobalSourceState &gstate_p) const {
	auto &gstate = gstate_p.Cast<PhysicalOrderGlobalSourceState>();
	return make_uniq<PhysicalOrderLocalSourceState>(gstate);
}